

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_graph.h
# Opt level: O3

void __thiscall PP_point::PP_point(PP_point *this,PP_point *other)

{
  long lVar1;
  double dVar2;
  pointer pPVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  this->_vptr_PP_point = (_func_int **)&PTR__PP_point_00115c18;
  (this->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dVar2 = other->y;
  this->x = other->x;
  this->y = dVar2;
  this->z = other->z;
  pPVar3 = (other->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((other->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      std::vector<PP_edge,_std::allocator<PP_edge>_>::push_back(&this->e,pPVar3 + uVar4);
      pPVar3 = (other->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(other->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar3 >> 4) * -0x71c71c71c71c71c7;
      bVar6 = uVar5 <= uVar4;
      lVar1 = uVar4 - uVar5;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6 && lVar1 != 0);
  }
  this->canBePartOfGraph = other->canBePartOfGraph;
  return;
}

Assistant:

PP_point( PP_point& other )
    {
        this->x = other.x;
        this->y = other.y;
        this->z = other.z;
        this->e.clear();
        for(unsigned int i=0 ; i<other.e.size() ; i++)
            this->e.push_back(other.e.at(i));
        this->canBePartOfGraph = other.canBePartOfGraph;
    }